

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

SnapArrayInfo<int> *
TTD::NSSnapObjects::ParseAddtlInfo_SnapArrayInfoCore<int>(FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint uVar4;
  int32 iVar5;
  SnapArrayInfoBlock<int> *pSVar6;
  uchar *puVar7;
  int *piVar8;
  SnapArrayInfo<int> *pSVar9;
  SnapArrayInfo<int> *res;
  uint32 j;
  uint32 i;
  SnapArrayInfoBlock<int> *tmp;
  uint32 k;
  uint32 blockCount;
  SnapArrayInfoBlock<int> *curr;
  SnapArrayInfoBlock<int> *arrayInfo;
  uint32 alength;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  
  uVar1 = FileReader::ReadLengthValue(reader,true);
  curr = (SnapArrayInfoBlock<int> *)0x0;
  _k = (SnapArrayInfoBlock<int> *)0x0;
  uVar2 = FileReader::ReadLengthValue(reader,true);
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  tmp._0_4_ = 0;
  while( true ) {
    if (uVar2 <= (uint)tmp) {
      (*reader->_vptr_FileReader[5])();
      pSVar9 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayInfo<int>>
                         (alloc);
      pSVar9->Length = uVar1;
      pSVar9->Data = curr;
      return pSVar9;
    }
    (*reader->_vptr_FileReader[6])(reader,(ulong)((uint)tmp != 0));
    pSVar6 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayInfoBlock<int>>
                       (alloc);
    uVar3 = FileReader::ReadUInt32(reader,index,false);
    pSVar6->FirstIndex = uVar3;
    uVar3 = FileReader::ReadUInt32(reader,offset,true);
    pSVar6->LastIndex = uVar3;
    puVar7 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>
                       (alloc,(ulong)(pSVar6->LastIndex - pSVar6->FirstIndex));
    pSVar6->ArrayValidTags = puVar7;
    piVar8 = SlabAllocatorBase<0>::SlabAllocateArray<int>
                       (alloc,(ulong)(pSVar6->LastIndex - pSVar6->FirstIndex));
    pSVar6->ArrayRangeContents = piVar8;
    pSVar6->Next = (SnapArrayInfoBlock<int> *)0x0;
    if (_k != (SnapArrayInfoBlock<int> *)0x0) {
      _k->Next = pSVar6;
    }
    if (pSVar6 == (SnapArrayInfoBlock<int> *)0x0) break;
    if (curr == (SnapArrayInfoBlock<int> *)0x0) {
      curr = pSVar6;
    }
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    for (res._4_4_ = pSVar6->FirstIndex; res._4_4_ < pSVar6->LastIndex; res._4_4_ = res._4_4_ + 1) {
      uVar4 = res._4_4_ - pSVar6->FirstIndex;
      (*reader->_vptr_FileReader[6])(reader,(ulong)(uVar4 != 0));
      iVar5 = FileReader::ReadInt32(reader,isValid,false);
      pSVar6->ArrayValidTags[uVar4] = (byte)iVar5;
      if (pSVar6->ArrayValidTags[uVar4] != '\0') {
        SnapArrayInfo_ParseValue(pSVar6->ArrayRangeContents + uVar4,reader,alloc);
      }
      (*reader->_vptr_FileReader[7])();
    }
    (*reader->_vptr_FileReader[5])();
    (*reader->_vptr_FileReader[7])();
    tmp._0_4_ = (uint)tmp + 1;
    _k = pSVar6;
  }
  TTDAbort_unrecoverable_error("Sanity assert failed.");
}

Assistant:

SnapArrayInfo<T>* ParseAddtlInfo_SnapArrayInfoCore(FileReader* reader, SlabAllocator& alloc)
        {
            uint32 alength = reader->ReadLengthValue(true);

            SnapArrayInfoBlock<T>* arrayInfo = nullptr;
            SnapArrayInfoBlock<T>* curr = nullptr;

            uint32 blockCount = reader->ReadLengthValue(true);
            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 k = 0; k < blockCount; ++k)
            {
                reader->ReadRecordStart(k != 0);

                SnapArrayInfoBlock<T>* tmp = alloc.SlabAllocateStruct< SnapArrayInfoBlock<T> >();
                tmp->FirstIndex = reader->ReadUInt32(NSTokens::Key::index);
                tmp->LastIndex = reader->ReadUInt32(NSTokens::Key::offset, true);

                tmp->ArrayValidTags = alloc.SlabAllocateArray<byte>(tmp->LastIndex - tmp->FirstIndex);
                tmp->ArrayRangeContents = alloc.SlabAllocateArray<T>(tmp->LastIndex - tmp->FirstIndex);
                tmp->Next = nullptr;

                if(curr != nullptr)
                {
                    curr->Next = tmp;
                }
                curr = tmp;
                TTDAssert(curr != nullptr, "Sanity assert failed.");

                if(arrayInfo == nullptr)
                {
                    arrayInfo = curr;
                }

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = curr->FirstIndex; i < curr->LastIndex; ++i)
                {
                    uint32 j = (i - curr->FirstIndex);
                    reader->ReadRecordStart(j != 0);

                    curr->ArrayValidTags[j] = (byte)reader->ReadInt32(NSTokens::Key::isValid);
                    if(curr->ArrayValidTags[j])
                    {
                        SnapArrayInfo_ParseValue(curr->ArrayRangeContents + j, reader, alloc);
                    }
                    reader->ReadRecordEnd();
                }
                reader->ReadSequenceEnd();
                reader->ReadRecordEnd();
            }
            reader->ReadSequenceEnd();

            SnapArrayInfo<T>* res = alloc.SlabAllocateStruct< SnapArrayInfo<T> >();
            res->Length = alength;
            res->Data = arrayInfo;

            return res;
        }